

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown.cpp
# Opt level: O2

ssize_t __thiscall markdown::Document::read(Document *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  element_type *peVar2;
  bool bVar3;
  undefined8 in_RAX;
  undefined7 uVar6;
  __ssize_t _Var4;
  BlankLine *this_00;
  RawText *this_01;
  undefined8 uVar5;
  FILE *__stream;
  undefined4 in_register_00000034;
  shared_ptr<markdown::Token> local_80;
  Container *local_70;
  TokenGroup tgt;
  string line;
  
  bVar1 = this->mProcessed;
  uVar6 = (undefined7)((ulong)in_RAX >> 8);
  if (bVar1 != false) {
LAB_00137570:
    return CONCAT71(uVar6,bVar1) ^ 1;
  }
  peVar2 = (this->mTokenContainer).px;
  if (peVar2 != (element_type *)0x0) {
    __stream = (FILE *)0x0;
    local_70 = (Container *)__dynamic_cast(peVar2,&Token::typeinfo,&token::Container::typeinfo);
    if (local_70 != (Container *)0x0) {
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      tgt.
      super__List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
      ._M_impl._M_node._M_size = 0;
      line.field_2._M_local_buf[0] = '\0';
      tgt.
      super__List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&tgt;
      tgt.
      super__List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&tgt;
      while( true ) {
        _Var4 = _getline(this,(char **)CONCAT44(in_register_00000034,__fd),(size_t *)&line,__stream)
        ;
        if ((char)_Var4 == '\0') break;
        bVar3 = anon_unknown.dwarf_2b976::isBlankLine(&line);
        if (bVar3) {
          this_00 = (BlankLine *)operator_new(0x30);
          token::BlankLine::BlankLine(this_00,&line);
          boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::BlankLine>
                    (&local_80,this_00);
          std::__cxx11::
          list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
          ::push_back((list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                       *)&tgt,&local_80);
        }
        else {
          this_01 = (RawText *)operator_new(0x30);
          token::RawText::RawText(this_01,&line,true);
          boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::RawText>
                    (&local_80,this_01);
          std::__cxx11::
          list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
          ::push_back((list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                       *)&tgt,&local_80);
        }
        boost::detail::shared_count::~shared_count(&local_80.pn);
      }
      token::Container::appendSubtokens
                (local_70,(TokenGroup *)
                          &tgt.
                           super__List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                );
      std::__cxx11::
      _List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
      ::_M_clear(&tgt.
                  super__List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                );
      uVar5 = std::__cxx11::string::~string((string *)&line);
      uVar6 = (undefined7)((ulong)uVar5 >> 8);
      goto LAB_00137570;
    }
  }
  __assert_fail("tokens!=0",
                "/workspace/llm4binary/github/license_c_cmakelists/sevenjay[P]cpp-markdown/src/markdown.cpp"
                ,0x294,"bool markdown::Document::read(std::istream &)");
}

Assistant:

bool Document::read(std::istream& in) {
	if (mProcessed) return false;

	token::Container *tokens=dynamic_cast<token::Container*>(mTokenContainer.get());
	assert(tokens!=0);

	std::string line;
	TokenGroup tgt;
	while (_getline(in, line)) {
		if (isBlankLine(line)) {
			tgt.push_back(TokenPtr(new token::BlankLine(line)));
		} else {
			tgt.push_back(TokenPtr(new token::RawText(line)));
		}
	}
	tokens->appendSubtokens(tgt);

	return true;
}